

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_factory.cxx
# Opt level: O0

void __thiscall xr_entity_factory::load_system_ini(xr_entity_factory *this,char *game_config)

{
  xr_ini_file *pxVar1;
  char *game_config_local;
  xr_entity_factory *this_local;
  
  pxVar1 = this->m_system_ini;
  if (pxVar1 != (xr_ini_file *)0x0) {
    xray_re::xr_ini_file::~xr_ini_file(pxVar1);
    operator_delete(pxVar1,0x18);
  }
  pxVar1 = (xr_ini_file *)operator_new(0x18);
  xray_re::xr_ini_file::xr_ini_file(pxVar1,game_config,"system.ltx");
  this->m_system_ini = pxVar1;
  return;
}

Assistant:

void xr_entity_factory::load_system_ini(const char* game_config)
{
	delete m_system_ini;
	m_system_ini = new xr_ini_file(game_config, "system.ltx");
}